

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smyblas2.c
# Opt level: O0

void susolve(int ldm,int ncol,float *M,float *rhs)

{
  float fVar1;
  float fVar2;
  int local_30;
  int local_2c;
  int irow;
  int j;
  int jcol;
  float xj;
  float *rhs_local;
  float *M_local;
  int ncol_local;
  int ldm_local;
  
  irow = ncol + -1;
  for (local_2c = 0; local_2c < ncol; local_2c = local_2c + 1) {
    fVar1 = rhs[irow];
    fVar2 = M[irow + irow * ldm];
    rhs[irow] = fVar1 / fVar2;
    for (local_30 = 0; local_30 < irow; local_30 = local_30 + 1) {
      rhs[local_30] = -(fVar1 / fVar2) * M[local_30 + irow * ldm] + rhs[local_30];
    }
    irow = irow + -1;
  }
  return;
}

Assistant:

void
susolve (int ldm, int ncol, float *M, float *rhs)
{
    float xj;
    int jcol, j, irow;

    jcol = ncol - 1;

    for (j = 0; j < ncol; j++) {

	xj = rhs[jcol] / M[jcol + jcol*ldm]; 		/* M(jcol, jcol) */
	rhs[jcol] = xj;
	
	for (irow = 0; irow < jcol; irow++)
	    rhs[irow] -= xj * M[irow + jcol*ldm];	/* M(irow, jcol) */

	jcol--;

    }
}